

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O0

DdNode * Extra_bddBitsToCube(DdManager *dd,int Code,int CodeWidth,DdNode **pbVars,int fMsbFirst)

{
  DdNode *n;
  byte bVar1;
  DdNode *local_50;
  DdNode *local_48;
  DdNode *bResult;
  DdNode *bVarBdd;
  DdNode *bVar;
  DdNode *bTemp;
  int z;
  int fMsbFirst_local;
  DdNode **pbVars_local;
  int CodeWidth_local;
  int Code_local;
  DdManager *dd_local;
  
  local_48 = dd->one;
  Cudd_Ref(local_48);
  for (bTemp._0_4_ = 0; (int)bTemp < CodeWidth; bTemp._0_4_ = (int)bTemp + 1) {
    if (pbVars == (DdNode **)0x0) {
      local_50 = dd->vars[(int)bTemp];
    }
    else {
      local_50 = pbVars[(int)bTemp];
    }
    bVar1 = (byte)(int)bTemp;
    if (fMsbFirst != 0) {
      bVar1 = ((char)CodeWidth + -1) - bVar1;
    }
    bVarBdd = (DdNode *)((ulong)local_50 ^ (long)(int)(uint)((Code & 1 << (bVar1 & 0x1f)) == 0));
    n = Cudd_bddAnd(dd,local_48,bVarBdd);
    Cudd_Ref(n);
    Cudd_RecursiveDeref(dd,local_48);
    local_48 = n;
  }
  Cudd_Deref(local_48);
  return local_48;
}

Assistant:

DdNode * Extra_bddBitsToCube( DdManager * dd, int Code, int CodeWidth, DdNode ** pbVars, int fMsbFirst )
{
    int z;
    DdNode * bTemp, * bVar, * bVarBdd, * bResult;

    bResult = b1;   Cudd_Ref( bResult );
    for ( z = 0; z < CodeWidth; z++ )
    {
        bVarBdd = (pbVars)? pbVars[z]: dd->vars[z];
        if ( fMsbFirst )
            bVar = Cudd_NotCond( bVarBdd, (Code & (1 << (CodeWidth-1-z)))==0 );
        else
            bVar = Cudd_NotCond( bVarBdd, (Code & (1 << (z)))==0 );
        bResult = Cudd_bddAnd( dd, bTemp = bResult, bVar );     Cudd_Ref( bResult );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bResult );

    return bResult;
}